

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLex.cpp
# Opt level: O2

void __thiscall UnitTest_lex2::UnitTest_lex2(UnitTest_lex2 *this)

{
  UnitTestBase::UnitTestBase(&this->super_UnitTestBase);
  (this->super_UnitTestBase)._vptr_UnitTestBase = (_func_int **)&PTR_Run_00196868;
  std::__cxx11::string::assign((char *)&(this->super_UnitTestBase).test_name_);
  return;
}

Assistant:

TEST_CASE(lex2)
{
    LexerWrapper lexer("-- this is comment\n"
                       "--[[this is long\n comment]]"
                       "--[[this is long\n comment too--]]"
                       "--[[incomplete comment]");

    EXPECT_EXCEPTION(luna::LexException, {
        lexer.GetToken();
    });
}